

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_addc_CC(DisasContext_conflict14 *ctx,TCGv_i32 ret,TCGv_i32 r1,TCGv_i32 r2)

{
  TCGContext_conflict9 *s;
  TCGTemp *pTVar1;
  TCGTemp *a2;
  uintptr_t o_1;
  TCGv_i32 ret_00;
  uintptr_t o_4;
  TCGv_i32 ah;
  uintptr_t o_3;
  TCGv_i32 rl;
  uintptr_t o;
  
  s = ctx->uc->tcg_ctx;
  pTVar1 = tcg_temp_new_internal_tricore(s,TCG_TYPE_I32,false);
  ret_00 = (TCGv_i32)((long)pTVar1 - (long)s);
  pTVar1 = tcg_temp_new_internal_tricore(s,TCG_TYPE_I32,false);
  ah = (TCGv_i32)((long)pTVar1 - (long)s);
  a2 = tcg_temp_new_internal_tricore(s,TCG_TYPE_I32,false);
  rl = (TCGv_i32)((long)a2 - (long)s);
  tcg_gen_op2_tricore(s,INDEX_op_movi_i32,(TCGArg)pTVar1,0);
  tcg_gen_setcondi_i32_tricore(s,TCG_COND_NE,ret_00,s->cpu_PSW_C,0);
  tcg_gen_add2_i32_tricore(s,rl,s->cpu_PSW_C,r1,ah,ret_00,ah);
  tcg_gen_add2_i32_tricore(s,rl,s->cpu_PSW_C,rl,s->cpu_PSW_C,r2,ah);
  tcg_gen_op3_tricore(s,INDEX_op_xor_i32,(TCGArg)(s->cpu_PSW_V + (long)s),(TCGArg)a2,
                      (TCGArg)(r1 + (long)s));
  tcg_gen_op3_tricore(s,INDEX_op_xor_i32,(TCGArg)pTVar1,(TCGArg)(r1 + (long)s),
                      (TCGArg)(r2 + (long)s));
  tcg_gen_andc_i32_tricore(s,s->cpu_PSW_V,s->cpu_PSW_V,ah);
  tcg_gen_op3_tricore(s,INDEX_op_or_i32,(TCGArg)(s->cpu_PSW_SV + (long)s),
                      (TCGArg)(s->cpu_PSW_SV + (long)s),(TCGArg)(s->cpu_PSW_V + (long)s));
  tcg_gen_op3_tricore(s,INDEX_op_add_i32,(TCGArg)(s->cpu_PSW_AV + (long)s),(TCGArg)a2,(TCGArg)a2);
  tcg_gen_op3_tricore(s,INDEX_op_xor_i32,(TCGArg)(s->cpu_PSW_AV + (long)s),(TCGArg)a2,
                      (TCGArg)(s->cpu_PSW_AV + (long)s));
  tcg_gen_op3_tricore(s,INDEX_op_or_i32,(TCGArg)(s->cpu_PSW_SAV + (long)s),
                      (TCGArg)(s->cpu_PSW_SAV + (long)s),(TCGArg)(s->cpu_PSW_AV + (long)s));
  if (rl != ret) {
    tcg_gen_op2_tricore(s,INDEX_op_mov_i32,(TCGArg)(ret + (long)s),(TCGArg)a2);
  }
  tcg_temp_free_internal_tricore(s,(TCGTemp *)(rl + (long)s));
  tcg_temp_free_internal_tricore(s,(TCGTemp *)(ah + (long)s));
  tcg_temp_free_internal_tricore(s,(TCGTemp *)(ret_00 + (long)s));
  return;
}

Assistant:

static inline void gen_addc_CC(DisasContext *ctx, TCGv ret, TCGv r1, TCGv r2)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv carry = tcg_temp_new_i32(tcg_ctx);
    TCGv t0    = tcg_temp_new_i32(tcg_ctx);
    TCGv result = tcg_temp_new_i32(tcg_ctx);

    tcg_gen_movi_tl(tcg_ctx, t0, 0);
    tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_NE, carry, tcg_ctx->cpu_PSW_C, 0);
    /* Addition, carry and set C/V/SV bits */
    tcg_gen_add2_i32(tcg_ctx, result, tcg_ctx->cpu_PSW_C, r1, t0, carry, t0);
    tcg_gen_add2_i32(tcg_ctx, result, tcg_ctx->cpu_PSW_C, result, tcg_ctx->cpu_PSW_C, r2, t0);
    /* calc V bit */
    tcg_gen_xor_tl(tcg_ctx, tcg_ctx->cpu_PSW_V, result, r1);
    tcg_gen_xor_tl(tcg_ctx, t0, r1, r2);
    tcg_gen_andc_tl(tcg_ctx, tcg_ctx->cpu_PSW_V, tcg_ctx->cpu_PSW_V, t0);
    /* Calc SV bit */
    tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_PSW_SV, tcg_ctx->cpu_PSW_SV, tcg_ctx->cpu_PSW_V);
    /* Calc AV/SAV bits */
    tcg_gen_add_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, result, result);
    tcg_gen_xor_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, result, tcg_ctx->cpu_PSW_AV);
    /* calc SAV */
    tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_PSW_SAV, tcg_ctx->cpu_PSW_SAV, tcg_ctx->cpu_PSW_AV);
    /* write back result */
    tcg_gen_mov_tl(tcg_ctx, ret, result);

    tcg_temp_free(tcg_ctx, result);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, carry);
}